

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Gia_ObjEvalEdgeDelay(Gia_Man_t *p,int iObj,Vec_Int_t *vDelay)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  pVVar2 = p->vMapping;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    if (iObj < 0) goto LAB_001f7cf7;
  }
  else {
    if ((iObj < 0) || (pVVar2->nSize <= iObj)) goto LAB_001f7cd8;
    piVar3 = pVVar2->pArray;
    uVar1 = piVar3[(uint)iObj];
    uVar8 = (ulong)uVar1;
    if (uVar8 != 0) {
      if ((-1 < (int)uVar1) && (uVar1 < (uint)pVVar2->nSize)) {
        iVar5 = piVar3[uVar8];
        if (4 < (long)iVar5) {
          __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                        ,0xb6,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
        }
        if (iVar5 < 1) {
          return 0;
        }
        lVar9 = 0;
        iVar4 = 0;
        do {
          iVar7 = piVar3[uVar8 + lVar9 + 1];
          if ((((long)iVar7 < 0) || (vDelay->nSize <= iVar7)) || (p->vEdge1->nSize <= iObj)) break;
          iVar6 = 2;
          if (p->vEdge1->pArray[(uint)iObj] != iVar7) {
            if (p->vEdge2->nSize <= iObj) break;
            iVar6 = (uint)(p->vEdge2->pArray[(uint)iObj] != iVar7) * 8 + 2;
          }
          iVar6 = iVar6 + vDelay->pArray[iVar7];
          if (iVar4 <= iVar6) {
            iVar4 = iVar6;
          }
          lVar9 = lVar9 + 1;
          if (iVar5 == lVar9) {
            return iVar4;
          }
        } while( true );
      }
      goto LAB_001f7cd8;
    }
  }
  if (p->vMapping2->nSize <= iObj) {
LAB_001f7cf7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar2 = p->vMapping2->pArray;
  uVar1 = pVVar2[(uint)iObj].nSize;
  uVar8 = (ulong)uVar1;
  if (uVar8 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0xc6,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
  }
  if (4 < (int)uVar1) {
    __assert_fail("Gia_ObjLutSize2(p, iObj) <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0xbf,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
  }
  if ((int)uVar1 < 1) {
    return 0;
  }
  uVar10 = 0;
  iVar5 = 0;
  while (uVar8 != uVar10) {
    iVar4 = pVVar2[(uint)iObj].pArray[uVar10];
    if ((((long)iVar4 < 0) || (vDelay->nSize <= iVar4)) || (p->vEdge1->nSize <= iObj)) break;
    iVar7 = 2;
    if (p->vEdge1->pArray[(uint)iObj] != iVar4) {
      if (p->vEdge2->nSize <= iObj) break;
      iVar7 = (uint)(p->vEdge2->pArray[(uint)iObj] != iVar4) * 8 + 2;
    }
    iVar7 = iVar7 + vDelay->pArray[iVar4];
    if (iVar5 <= iVar7) {
      iVar5 = iVar7;
    }
    uVar10 = uVar10 + 1;
    if (uVar8 == uVar10) {
      return iVar5;
    }
  }
LAB_001f7cd8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Gia_ObjEvalEdgeDelay( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay )
{
    int nEdgeDelay = 2;
    int i, iFan, Delay, DelayMax = 0;
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry(vDelay, iFan) + (Gia_ObjHaveEdge(p, iObj, iFan) ? nEdgeDelay : 10);
            DelayMax = Abc_MaxInt( DelayMax, Delay );
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        assert( Gia_ObjLutSize2(p, iObj) <= 4 );
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry(vDelay, iFan) + (Gia_ObjHaveEdge(p, iObj, iFan) ? nEdgeDelay : 10);
            DelayMax = Abc_MaxInt( DelayMax, Delay );
        }
    }
    else assert( 0 );
    return DelayMax;
}